

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.c
# Opt level: O0

Image * LoadImageAnim(Image *__return_storage_ptr__,char *fileName,int *frames)

{
  _Bool _Var1;
  stbi_uc *psVar2;
  Image local_50;
  void *local_38;
  int **delays;
  uchar *puStack_28;
  int comp;
  uchar *fileData;
  uint dataSize;
  int framesCount;
  int *frames_local;
  char *fileName_local;
  
  _dataSize = frames;
  frames_local = (int *)fileName;
  memset(__return_storage_ptr__,0,0x18);
  fileData._4_4_ = 1;
  _Var1 = IsFileExtension((char *)frames_local,".gif");
  if (_Var1) {
    fileData._0_4_ = 0;
    puStack_28 = LoadFileData((char *)frames_local,(uint *)&fileData);
    if (puStack_28 != (uchar *)0x0) {
      delays._4_4_ = 0;
      local_38 = (void *)0x0;
      psVar2 = stbi_load_gif_from_memory
                         (puStack_28,(int)fileData,(int **)0x0,&__return_storage_ptr__->width,
                          &__return_storage_ptr__->height,(int *)((long)&fileData + 4),
                          (int *)((long)&delays + 4),4);
      __return_storage_ptr__->data = psVar2;
      __return_storage_ptr__->mipmaps = 1;
      __return_storage_ptr__->format = 7;
      free(puStack_28);
      free(local_38);
    }
  }
  else {
    LoadImage(&local_50,(char *)frames_local);
    __return_storage_ptr__->data = local_50.data;
    __return_storage_ptr__->width = local_50.width;
    __return_storage_ptr__->height = local_50.height;
    __return_storage_ptr__->mipmaps = local_50.mipmaps;
    __return_storage_ptr__->format = local_50.format;
  }
  *_dataSize = fileData._4_4_;
  return __return_storage_ptr__;
}

Assistant:

Image LoadImageAnim(const char *fileName, int *frames)
{
    Image image = { 0 };
    int framesCount = 1;

#if defined(SUPPORT_FILEFORMAT_GIF)
    if (IsFileExtension(fileName, ".gif"))
    {
        unsigned int dataSize = 0;
        unsigned char *fileData = LoadFileData(fileName, &dataSize);

        if (fileData != NULL)
        {
            int comp = 0;
            int **delays = NULL;
            image.data = stbi_load_gif_from_memory(fileData, dataSize, delays, &image.width, &image.height, &framesCount, &comp, 4);

            image.mipmaps = 1;
            image.format = PIXELFORMAT_UNCOMPRESSED_R8G8B8A8;

            RL_FREE(fileData);
            RL_FREE(delays);        // NOTE: Frames delays are discarded
        }
    }
#else
    if (false) { }
#endif
    else image = LoadImage(fileName);

    // TODO: Support APNG animated images?

    *frames = framesCount;
    return image;
}